

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

void EnsureNameValid(ON_wString *name)

{
  int iVar1;
  wchar_t *pwVar2;
  wchar_t s;
  bool bVar3;
  int i;
  ON_wString name_copy;
  ON_wString OStack_38;
  
  ON_wString::ON_wString(&OStack_38,name);
  ON_wString::operator=(name,L"");
  iVar1 = ON_wString::Length(&OStack_38);
  if (0 < iVar1) {
    bVar3 = true;
    i = 0;
    do {
      pwVar2 = ON_wString::operator[](&OStack_38,i);
      s = *pwVar2;
      if (bVar3) {
        if ((((0x3d < (uint)(s + L'\xffffffe0')) ||
             ((0x2800000000000301U >> ((ulong)(uint)(s + L'\xffffffe0') & 0x3f) & 1) == 0)) &&
            (s != L'{')) && (s != L'}')) {
          bVar3 = false;
          goto LAB_005a2c04;
        }
      }
      else {
LAB_005a2c04:
        if (s < L'!') {
          s = L' ';
        }
        ON_wString::operator+=(name,s);
      }
      i = i + 1;
    } while (iVar1 != i);
  }
  ON_wString::TrimLeftAndRight(name,(wchar_t *)0x0);
  ON_wString::~ON_wString(&OStack_38);
  return;
}

Assistant:

static void EnsureNameValid(ON_wString& name)
{
  // 29th November 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-78603
  // Component names cannot begin with '(', ')', '[', ']', '{', '}' or ' '.
  // Component names should not be multiline.
  // I'm also going to disallow ':' because that has a special meaning in the name and
  // render content does not use that feature.

  ON_wString name_copy = name;
  name = L"";

  bool first = true;
  const int len = name_copy.Length();
  for (int i = 0; i < len; i++)
  {
    wchar_t c = name_copy[i];
    if (first)
    {
      if ( c == L' '                ) continue;
      if ((c == L'(') || (c == L')')) continue;
      if ((c == L'[') || (c == L']')) continue;
      if ((c == L'{') || (c == L'}')) continue;

      first = false;
    }

    // Replace control codes with a space. Includes CR/LF.
    if (c < L' ')
      c = L' ';

    name += c;
  }

  // 2024-08-27 : kike@mcneel.com
  // `ON_ModelComponent::IsValidComponentName` allows ':'.
  // The hole point of https://mcneel.myjetbrains.com/youtrack/issue/RH-78603
  // is to ensure all type names has same restrictions.
  // 
  //// Also disallow ':' inside the name.
  //name.Replace(':', ' ');

  name.TrimLeftAndRight();
}